

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fat.cpp
# Opt level: O0

void __thiscall fat::print_info(fat *this)

{
  ostream *poVar1;
  uint local_14;
  int i;
  fat *this_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "--------------------------------------------------------");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"BOOT RECORD");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "--------------------------------------------------------");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"volume_descriptor: ");
  poVar1 = std::operator<<(poVar1,this->fs_br->volume_descriptor);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  printf("fat_type: %d\n",(ulong)(uint)(int)this->fs_br->fat_type);
  printf("fat_copies: %d\n",(ulong)(uint)(int)this->fs_br->fat_copies);
  poVar1 = std::operator<<((ostream *)&std::cout,"cluster_size: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->fs_br->cluster_size);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"usable_cluster_count: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->fs_br->usable_cluster_count);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"signature: ");
  poVar1 = std::operator<<(poVar1,this->fs_br->signature);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "--------------------------------------------------------");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"FAT table");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "--------------------------------------------------------");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  for (local_14 = 0; (int)local_14 < this->fs_br->usable_cluster_count; local_14 = local_14 + 1) {
    printf("[%d] %d\n",(ulong)local_14,(ulong)(uint)this->fat_table[(int)local_14]);
  }
  return;
}

Assistant:

void fat::print_info() {
    std::cout << "--------------------------------------------------------" << std::endl;
    std::cout << "BOOT RECORD" << std::endl;
    std::cout << "--------------------------------------------------------" << std::endl;
    std::cout << "volume_descriptor: " << fs_br->volume_descriptor << std::endl;
    printf("fat_type: %d\n", fs_br->fat_type);
    printf("fat_copies: %d\n", fs_br->fat_copies);
    std::cout << "cluster_size: " << fs_br->cluster_size << std::endl;
    std::cout << "usable_cluster_count: " << fs_br->usable_cluster_count << std::endl;
    std::cout << "signature: " << fs_br->signature << std::endl;

    std::cout << "--------------------------------------------------------" << std::endl;
    std::cout << "FAT table" << std::endl;
    std::cout << "--------------------------------------------------------" << std::endl;
    for (int i = 0; i < fs_br->usable_cluster_count; i++) {
        //if (fat_table[i] != FAT_UNUSED) {
        printf("[%d] %d\n", i, fat_table[i]);
        //}
    }
}